

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::CommitBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
               *this,TEmitBufferAllocation *allocation,size_t destBufferBytes,BYTE *destBuffer,
              size_t bytes,BYTE *sourceBuffer,DWORD alignPad)

{
  size_t sVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  ulong dwSize;
  ulong uVar7;
  BYTE *pBVar8;
  BYTE *buffer;
  size_t count;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  BYTE *local_80;
  uint local_3c;
  
  CCLock::Enter(&(this->criticalSection).super_CCLock);
  if (destBuffer == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1cf,"(destBuffer != nullptr)","destBuffer != nullptr");
    if (!bVar4) goto LAB_0040af40;
    *puVar6 = 0;
  }
  if (allocation == (TEmitBufferAllocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d0,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar4) goto LAB_0040af40;
    *puVar6 = 0;
  }
  if (allocation->bytesCommitted != destBufferBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d4,"(destBufferBytes == allocation->bytesCommitted)",
                       "destBufferBytes == allocation->bytesCommitted");
    if (!bVar4) goto LAB_0040af40;
    *puVar6 = 0;
  }
  local_3c = alignPad;
  dwSize = alignPad + bytes;
  if (destBufferBytes < allocation->bytesUsed + dwSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d7,"(allocation->bytesUsed + bytes + alignPad <= destBufferBytes)",
                       "allocation->bytesUsed + bytes + alignPad <= destBufferBytes");
    if (!bVar4) goto LAB_0040af40;
    *puVar6 = 0;
  }
  sVar1 = allocation->bytesUsed;
  pcVar2 = allocation->allocation->address;
  if ((uint)((int)allocation->bytesCommitted - (int)sVar1) < dwSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1db,"(allocation->BytesFree() >= bytes + alignPad)",
                       "allocation->BytesFree() >= bytes + alignPad");
    if (!bVar4) {
LAB_0040af40:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  buffer = destBuffer + sVar1;
  uVar9 = dwSize;
  local_80 = sourceBuffer;
  do {
    if (uVar9 == 0) {
      BVar5 = FlushInstructionCache(this->processHandle,pcVar2 + sVar1,dwSize);
      if (BVar5 == 0) {
        bVar4 = false;
      }
      else {
        this->totalBytesCode = this->totalBytesCode + bytes;
        bVar4 = FinalizeAllocation(this,allocation,destBuffer);
      }
      goto LAB_0040af27;
    }
    if (buffer < destBuffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e4,"(destBuffer <= currentDestBuffer)",
                         "destBuffer <= currentDestBuffer");
      if (!bVar4) goto LAB_0040af40;
      *puVar6 = 0;
    }
    if (destBuffer + destBufferBytes <= buffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e5,"(currentDestBuffer < destBuffer + destBufferBytes)",
                         "currentDestBuffer < destBuffer + destBufferBytes");
      if (!bVar4) goto LAB_0040af40;
      *puVar6 = 0;
    }
    uVar10 = 0x1000 - ((uint)buffer & 0xfff);
    uVar7 = (ulong)uVar10;
    if (uVar9 < uVar10) {
      uVar7 = uVar9;
    }
    bVar4 = CheckCommitFaultInjection(this);
    pBVar8 = buffer;
    if (bVar4) {
      bVar4 = false;
    }
    else {
      BVar5 = Memory::CustomHeap::
              Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
              ProtectAllocationWithExecuteReadWrite
                        (&this->allocationHeap,allocation->allocation,(char *)buffer);
      bVar4 = false;
      if (BVar5 != 0) {
        if (local_3c == 0) {
          local_3c = 0;
          count = uVar7;
        }
        else {
          if (local_3c < uVar10) {
            uVar10 = local_3c;
          }
          uVar11 = (ulong)uVar10;
          Memory::CustomHeap::FillDebugBreak(buffer,uVar11);
          allocation->bytesUsed = allocation->bytesUsed + uVar11;
          local_3c = local_3c - uVar10;
          uVar9 = uVar9 - uVar11;
          this->totalBytesAlignment = this->totalBytesAlignment + uVar11;
          pBVar8 = buffer + uVar11;
          count = uVar7 - uVar11;
        }
        if (count != 0) {
          if (local_3c != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                               ,0x20e,"(alignPad == 0)",
                               "If we are copying right now - we should be done with setting alignment."
                              );
            if (!bVar4) goto LAB_0040af40;
            *puVar6 = 0;
          }
          uVar11 = (ulong)(uint)((int)allocation->bytesCommitted - (int)allocation->bytesUsed);
          if (destBuffer + destBufferBytes < pBVar8 + uVar11) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                               ,0x213,
                               "(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes)"
                               ,
                               "currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes"
                              );
            if (!bVar4) goto LAB_0040af40;
            *puVar6 = 0;
          }
          memcpy_s(pBVar8,uVar11,local_80,count);
          pBVar8 = pBVar8 + count;
          local_80 = local_80 + count;
          allocation->bytesUsed = allocation->bytesUsed + count;
          uVar9 = uVar9 - count;
        }
        if (buffer + uVar7 != pBVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                             ,0x21c,"(readWriteBuffer + readWriteBytes == currentDestBuffer)",
                             "readWriteBuffer + readWriteBytes == currentDestBuffer");
          if (!bVar4) goto LAB_0040af40;
          *puVar6 = 0;
        }
        BVar5 = Memory::CustomHeap::
                Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
                ProtectAllocationWithExecuteReadOnly
                          (&this->allocationHeap,allocation->allocation,(char *)buffer);
        bVar4 = BVar5 != 0;
      }
    }
    buffer = pBVar8;
  } while (bVar4);
  bVar4 = false;
LAB_0040af27:
  CCLock::Leave(&(this->criticalSection).super_CCLock);
  return bVar4;
}

Assistant:

bool
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CommitBuffer(TEmitBufferAllocation* allocation, __in const size_t destBufferBytes, __out_bcount(destBufferBytes) BYTE* destBuffer, __in size_t bytes, __in_bcount(bytes) const BYTE* sourceBuffer, __in DWORD alignPad)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(destBuffer != nullptr);
    Assert(allocation != nullptr);

    // The size of destBuffer is actually given by allocation->bytesCommitted, but due to a bug in some versions of PREFast, we can't refer to allocation->bytesCommitted in the
    // SAL annotation on destBuffer above.  We've informed the PREFast maintainers, but we'll have to use destBufferBytes as a workaround until their fix makes it to Jenkins.
    Assert(destBufferBytes == allocation->bytesCommitted);
    
    // Must have at least enough room in destBuffer for the initial skipped bytes plus the bytes we're going to write.
    AnalysisAssert(allocation->bytesUsed + bytes + alignPad <= destBufferBytes);

    BYTE *currentDestBuffer = destBuffer + allocation->GetBytesUsed();
    char *bufferToFlush = allocation->allocation->address + allocation->GetBytesUsed();
    Assert(allocation->BytesFree() >= bytes + alignPad);

    size_t bytesLeft = bytes + alignPad;
    size_t sizeToFlush = bytesLeft;

    // Copy the contents and set the alignment pad
    while(bytesLeft != 0)
    {
        // currentDestBuffer must still point to somewhere in the interior of destBuffer.
        AnalysisAssert(destBuffer <= currentDestBuffer);
        AnalysisAssert(currentDestBuffer < destBuffer + destBufferBytes);

        DWORD spaceInCurrentPage = AutoSystemInfo::PageSize - ((size_t)currentDestBuffer & (AutoSystemInfo::PageSize - 1));
        size_t bytesToChange = bytesLeft > spaceInCurrentPage ? spaceInCurrentPage : bytesLeft;


        // Buffer and the bytes that are marked RWX - these will eventually be marked as 'EXCEUTE' only.
        BYTE* readWriteBuffer = currentDestBuffer;
        size_t readWriteBytes = bytesToChange;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CheckCommitFaultInjection())
        {
            return false;
        }
#endif
        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadWrite(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }

        // Pad with debug-breakpoint instructions up to alignBytes or the end of the current page, whichever is less.
        if (alignPad != 0)
        {
            DWORD alignBytes = alignPad < spaceInCurrentPage ? alignPad : spaceInCurrentPage;
            CustomHeap::FillDebugBreak(currentDestBuffer, alignBytes);

            alignPad -= alignBytes;
            currentDestBuffer += alignBytes;
            allocation->bytesUsed += alignBytes;
            bytesLeft -= alignBytes;
            bytesToChange -= alignBytes;

#if DBG_DUMP
            this->totalBytesAlignment += alignBytes;
#endif
        }

        // If there are bytes still left to be copied then we should do the copy, but only through the end of the current page.
        if(bytesToChange > 0)
        {
            AssertMsg(alignPad == 0, "If we are copying right now - we should be done with setting alignment.");

            const DWORD bufferBytesFree(allocation->BytesFree());
            // Use <= here instead of < to allow this memcopy to fill up the rest of destBuffer.  If we do, then FinalizeAllocation,
            // called below, determines that no additional padding is necessary based on the values in `allocation'.
            AnalysisAssert(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes);
            memcpy_s(currentDestBuffer, bufferBytesFree, sourceBuffer, bytesToChange);

            currentDestBuffer += bytesToChange;
            sourceBuffer += bytesToChange;
            allocation->bytesUsed += bytesToChange;
            bytesLeft -= bytesToChange;
        }

        Assert(readWriteBuffer + readWriteBytes == currentDestBuffer);

        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadOnly(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }
    }

    if (!FlushInstructionCache(this->processHandle, bufferToFlush, sizeToFlush))
    {
        return false;
    }

#if DBG_DUMP
    this->totalBytesCode += bytes;
#endif

    //Finish the current EmitBufferAllocation by filling out the rest of destBuffer with debug breakpoint instructions.
    return FinalizeAllocation(allocation, destBuffer);
}